

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall ON_MappingRef::Write(ON_MappingRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_plugin_id);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_mapping_channels);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_MappingRef::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 0 );
  if (rc)
  {
    if (rc) rc = archive.WriteUuid( m_plugin_id );
    if (rc) rc = archive.WriteArray( m_mapping_channels );

    if ( !archive.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}